

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

App * __thiscall CLI::App::ignore_case(App *this,bool value)

{
  App *pAVar1;
  pointer puVar2;
  pointer pcVar3;
  App *this_00;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  OptionAlreadyAdded *this_01;
  pointer puVar7;
  string local_90;
  string local_70;
  string local_50;
  
  this->ignore_case_ = value;
  pAVar1 = this->parent_;
  if (pAVar1 != (App *)0x0) {
    puVar7 = (pAVar1->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pAVar1->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 != puVar2) {
      do {
        pAVar1 = (puVar7->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t
                 .super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                 super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
        if (pAVar1 == this) {
          bVar5 = false;
          bVar6 = false;
        }
        else {
          pcVar3 = (pAVar1->name_)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + (pAVar1->name_)._M_string_length);
          bVar5 = check_name(this,&local_70);
          if (bVar5) {
            bVar6 = true;
            bVar5 = false;
          }
          else {
            this_00 = (puVar7->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>
                      ._M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                      super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            pcVar3 = (this->name_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar3,pcVar3 + (this->name_)._M_string_length);
            bVar6 = check_name(this_00,&local_90);
            bVar5 = true;
          }
        }
        if ((bVar5) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2)) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((pAVar1 != this) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2)) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (bVar6 != false) {
          this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          pAVar1 = (puVar7->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                   _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                   super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          _Var4._M_p = (pAVar1->name_)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,_Var4._M_p,_Var4._M_p + (pAVar1->name_)._M_string_length);
          OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_50);
          __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar2);
    }
  }
  return this;
}

Assistant:

App *ignore_case(bool value = true) {
        ignore_case_ = value;
        if(parent_ != nullptr) {
            for(const auto &subc : parent_->subcommands_) {
                if(subc.get() != this && (this->check_name(subc->name_) || subc->check_name(this->name_)))
                    throw OptionAlreadyAdded(subc->name_);
            }
        }
        return this;
    }